

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode curl_easy_send(CURL *d,void *buffer,size_t buflen,size_t *n)

{
  _Bool _Var1;
  Curl_easy *data;
  size_t sStack_38;
  CURLcode result;
  size_t written;
  size_t *n_local;
  size_t buflen_local;
  void *buffer_local;
  CURL *d_local;
  
  sStack_38 = 0;
  written = (size_t)n;
  n_local = (size_t *)buflen;
  buflen_local = (size_t)buffer;
  buffer_local = d;
  _Var1 = Curl_is_in_callback((Curl_easy *)d);
  if (_Var1) {
    d_local._4_4_ = CURLE_RECURSIVE_API_CALL;
  }
  else {
    d_local._4_4_ =
         Curl_senddata((Curl_easy *)d,(void *)buflen_local,(size_t)n_local,&stack0xffffffffffffffc8)
    ;
    *(size_t *)written = sStack_38;
  }
  return d_local._4_4_;
}

Assistant:

CURLcode curl_easy_send(CURL *d, const void *buffer, size_t buflen, size_t *n)
{
  size_t written = 0;
  CURLcode result;
  struct Curl_easy *data = d;
  if(Curl_is_in_callback(data))
    return CURLE_RECURSIVE_API_CALL;

  result = Curl_senddata(data, buffer, buflen, &written);
  *n = written;
  return result;
}